

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

matches * mergematches(match a,matches *b)

{
  int iVar1;
  int iVar2;
  easm_expr *peVar3;
  int iVar4;
  int iVar5;
  matches *pmVar6;
  long lVar7;
  reloc *prVar8;
  match *pmVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  reloc *local_f8;
  matches *local_f0;
  ulong local_e8 [6];
  undefined8 local_b8 [16];
  int local_38;
  
  pmVar6 = (matches *)calloc(0x10,1);
  iVar5 = a.nrelocs;
  iVar4 = a.oplen;
  if (0 < b->mnum) {
    uVar13 = (ulong)(uint)a.nrelocs;
    local_f8 = a.relocs;
    lVar14 = 0x18;
    lVar12 = 0;
    local_f0 = b;
    do {
      lVar7 = 0;
      do {
        if ((*(ulong *)((long)b->m->a + lVar7 * 8 + lVar14 + -8) & a.m[lVar7] &
            (*(ulong *)((long)b->m->a + lVar7 * 8 + lVar14 + -0x18) ^ a.a[lVar7])) != 0)
        goto LAB_00246ee4;
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      lVar7 = 2;
LAB_00246ee4:
      if ((int)lVar7 == 2) {
        memcpy(local_e8,b->m + lVar12,0xb8);
        if ((int)local_e8[0] == 0) {
          local_e8[0]._0_4_ = iVar4;
        }
        lVar7 = 3;
        do {
          (&local_f8)[lVar7] =
               (reloc *)((ulong)(&local_f8)[lVar7] |
                        *(ulong *)(&stack0xfffffffffffffff8 + lVar7 * 8));
          local_e8[lVar7] = local_e8[lVar7] | a.a[lVar7 + -1];
          lVar7 = lVar7 + 1;
        } while (lVar7 == 4);
        if (8 < local_38 + iVar5) {
          __assert_fail("a.nrelocs + nm.nrelocs <= 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/envydis/core-as.c"
                        ,0x4c,"struct matches *mergematches(struct match, struct matches *)");
        }
        if (0 < iVar5) {
          uVar11 = 0;
          prVar8 = local_f8;
          do {
            lVar7 = (long)local_38;
            peVar3 = prVar8->expr;
            local_b8[(lVar7 + uVar11) * 2] = prVar8->bf;
            local_b8[(lVar7 + uVar11) * 2 + 1] = peVar3;
            uVar11 = uVar11 + 1;
            prVar8 = prVar8 + 1;
          } while (uVar13 != uVar11);
        }
        local_38 = local_38 + iVar5;
        iVar1 = pmVar6->mnum;
        iVar2 = pmVar6->mmax;
        if (iVar2 <= iVar1) {
          iVar10 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar10 = 0x10;
          }
          pmVar6->mmax = iVar10;
          pmVar9 = (match *)realloc(pmVar6->m,(long)iVar10 * 0xb8);
          pmVar6->m = pmVar9;
        }
        pmVar6->mnum = iVar1 + 1;
        memcpy(pmVar6->m + iVar1,local_e8,0xb8);
        b = local_f0;
      }
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0xb8;
    } while (lVar12 < b->mnum);
  }
  free(b->m);
  free(b);
  return pmVar6;
}

Assistant:

struct matches *mergematches(struct match a, struct matches *b) {
	struct matches *res = emptymatches();
	int i, j;
	for (i = 0; i < b->mnum; i++) {
		for (j = 0; j < MAXOPLEN; j++) {
			ull cmask = a.m[j] & b->m[i].m[j];
			if ((a.a[j] & cmask) != (b->m[i].a[j] & cmask))
				break;
		}
		if (j == MAXOPLEN) {
			struct match nm = b->m[i];
			if (!nm.oplen)
				nm.oplen = a.oplen;
			for (j = 0; j < MAXOPLEN; j++) {
				nm.a[j] |= a.a[j];
				nm.m[j] |= a.m[j];
			}
			int j;
			assert (a.nrelocs + nm.nrelocs <= 8);
			for (j = 0; j < a.nrelocs; j++)
				nm.relocs[nm.nrelocs + j] = a.relocs[j];
			nm.nrelocs += a.nrelocs;
			ADDARRAY(res->m, nm);
		}
	}
	free(b->m);
	free(b);
	return res;
}